

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int KINGetLinWorkSpace(void *kinmem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  int iVar2;
  long liw;
  long lrw;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  sunindextype liw1;
  sunindextype lrw1;
  long local_58;
  long local_50;
  KINLsMem local_48;
  KINMem local_40;
  long local_38;
  long local_30;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetLinWorkSpace",&local_40,&local_48);
  if (iVar1 == 0) {
    *lenrwLS = 1;
    *leniwLS = 0x15;
    if (local_40->kin_vtemp1->ops->nvspace !=
        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(local_40->kin_vtemp1,&local_30,&local_38);
      *lenrwLS = *lenrwLS + local_30;
      *leniwLS = *leniwLS + local_38;
    }
    if (local_48->LS->ops->space != (_func_SUNErrCode_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
      iVar2 = SUNLinSolSpace(local_48->LS,&local_50,&local_58);
      if (iVar2 == 0) {
        *lenrwLS = *lenrwLS + local_50;
        *leniwLS = *leniwLS + local_58;
      }
    }
  }
  return iVar1;
}

Assistant:

int KINGetLinWorkSpace(void* kinmem, long int* lenrwLS, long int* leniwLS)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 1;
  *leniwLS = 21;

  /* add N_Vector sizes */
  if (kin_mem->kin_vtemp1->ops->nvspace)
  {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    *lenrwLS += lrw1;
    *leniwLS += liw1;
  }

  /* add LS sizes */
  if (kinls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(kinls_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (KINLS_SUCCESS);
}